

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Kernel::MergeFrom(Kernel *this,Kernel *from)

{
  ulong uVar1;
  LogMessage *other;
  LinearKernel *pLVar2;
  PolyKernel *pPVar3;
  SigmoidKernel *pSVar4;
  RBFKernel *pRVar5;
  undefined1 *puVar6;
  Arena *pAVar7;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O1/mlmodel/format/SVM.pb.cc"
               ,0x55b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    if (this->_oneof_case_[0] != 1) {
      clear_kernel(this);
      this->_oneof_case_[0] = 1;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pLVar2 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::LinearKernel>
                         (pAVar7);
      (this->kernel_).linearkernel_ = pLVar2;
    }
    if (from->_oneof_case_[0] == 1) {
      puVar6 = (undefined1 *)(from->kernel_).linearkernel_;
    }
    else {
      puVar6 = _LinearKernel_default_instance_;
    }
    LinearKernel::MergeFrom((this->kernel_).linearkernel_,(LinearKernel *)puVar6);
    break;
  case 2:
    if (this->_oneof_case_[0] != 2) {
      clear_kernel(this);
      this->_oneof_case_[0] = 2;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pRVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::RBFKernel>(pAVar7)
      ;
      (this->kernel_).rbfkernel_ = pRVar5;
    }
    if (from->_oneof_case_[0] == 2) {
      puVar6 = (undefined1 *)(from->kernel_).rbfkernel_;
    }
    else {
      puVar6 = _RBFKernel_default_instance_;
    }
    RBFKernel::MergeFrom((this->kernel_).rbfkernel_,(RBFKernel *)puVar6);
    break;
  case 3:
    if (this->_oneof_case_[0] != 3) {
      clear_kernel(this);
      this->_oneof_case_[0] = 3;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pPVar3 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::PolyKernel>
                         (pAVar7);
      (this->kernel_).polykernel_ = pPVar3;
    }
    if (from->_oneof_case_[0] == 3) {
      puVar6 = (undefined1 *)(from->kernel_).polykernel_;
    }
    else {
      puVar6 = _PolyKernel_default_instance_;
    }
    PolyKernel::MergeFrom((this->kernel_).polykernel_,(PolyKernel *)puVar6);
    break;
  case 4:
    if (this->_oneof_case_[0] != 4) {
      clear_kernel(this);
      this->_oneof_case_[0] = 4;
      uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar7 = (Arena *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        pAVar7 = *(Arena **)pAVar7;
      }
      pSVar4 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SigmoidKernel>
                         (pAVar7);
      (this->kernel_).sigmoidkernel_ = pSVar4;
    }
    if (from->_oneof_case_[0] == 4) {
      puVar6 = (undefined1 *)(from->kernel_).sigmoidkernel_;
    }
    else {
      puVar6 = _SigmoidKernel_default_instance_;
    }
    SigmoidKernel::MergeFrom((this->kernel_).sigmoidkernel_,(SigmoidKernel *)puVar6);
  }
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

void Kernel::MergeFrom(const Kernel& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Kernel)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.kernel_case()) {
    case kLinearKernel: {
      _internal_mutable_linearkernel()->::CoreML::Specification::LinearKernel::MergeFrom(from._internal_linearkernel());
      break;
    }
    case kRbfKernel: {
      _internal_mutable_rbfkernel()->::CoreML::Specification::RBFKernel::MergeFrom(from._internal_rbfkernel());
      break;
    }
    case kPolyKernel: {
      _internal_mutable_polykernel()->::CoreML::Specification::PolyKernel::MergeFrom(from._internal_polykernel());
      break;
    }
    case kSigmoidKernel: {
      _internal_mutable_sigmoidkernel()->::CoreML::Specification::SigmoidKernel::MergeFrom(from._internal_sigmoidkernel());
      break;
    }
    case KERNEL_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}